

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtils.h
# Opt level: O0

bool ODDLParser::isFloat<char>(char *in,char *end)

{
  bool bVar1;
  bool local_21;
  bool result;
  char *end_local;
  char *in_local;
  
  end_local = in;
  if ((in != end) && (*in == '-')) {
    end_local = in + 1;
  }
  local_21 = false;
  do {
    bVar1 = isNotEndOfToken<char>(end_local,end);
    if (!bVar1) {
LAB_00b69938:
      if (*end_local == '.') {
        do {
          end_local = end_local + 1;
          bVar1 = isNotEndOfToken<char>(end_local,end);
          if (!bVar1) {
            return local_21;
          }
          local_21 = isNumeric<char>(*end_local);
        } while (local_21);
      }
      return false;
    }
    if (*end_local == '.') {
      local_21 = true;
      goto LAB_00b69938;
    }
    local_21 = isNumeric<char>(*end_local);
    if (!local_21) {
      return false;
    }
    end_local = end_local + 1;
  } while( true );
}

Assistant:

inline
bool isFloat( T *in, T *end ) {
    if( in != end ) {
        if( *in == '-' ) {
            ++in;
        }
    }

    // check for <1>.0f
    bool result( false );
    while( isNotEndOfToken( in, end ) ) {
        if( *in == '.' ) {
            result = true;
            break;
        }
        result = isNumeric( *in );
        if( !result ) {
            return false;
        }
        ++in;
    }

    // check for 1<.>0f
    if( *in == '.' ) {
        ++in;
    } else {
        return false;
    }

    // check for 1.<0>f
    while( isNotEndOfToken( in, end ) ) {
        result = isNumeric( *in );
        if( !result ) {
            return false;
        }
        ++in;
    }

    return result;
}